

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

parasail_result_t * parasail_result_new(void)

{
  parasail_result_t *ppVar1;
  
  ppVar1 = (parasail_result_t *)malloc(0x18);
  if (ppVar1 != (parasail_result_t *)0x0) {
    ppVar1->score = 0;
    ppVar1->end_query = 0;
    ppVar1->end_ref = 0;
    ppVar1->flag = 0;
    (ppVar1->field_4).extra = (void *)0x0;
    return ppVar1;
  }
  parasail_result_new_cold_1();
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* parasail_result_new()
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    PARASAIL_NEW(result, parasail_result_t);

    result->score = 0;
    result->end_query = 0;
    result->end_ref = 0;
    result->flag = 0;
    result->extra = NULL;

    return result;
}